

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O1

WJTL_STATUS TestMarshallStrings(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  JL_STATUS JVar8;
  WJTL_STATUS WVar9;
  char *jsonString;
  StringStruct theStruct;
  JlMarshallElement marshalStringStruct [2];
  char *local_120;
  ulong local_118 [2];
  char *local_108;
  JlMarshallElement local_f8 [2];
  
  memcpy(local_f8,&DAT_001419b0,0xc0);
  WVar9 = WJTL_STATUS_SUCCESS;
  local_108 = (char *)0x0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_120 = (char *)0x0;
  WVar1 = MakeJsonAndVerify(local_118,local_f8,2,"{\"fixedStr\":null,\"strPtr\":null}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":null}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x7b);
  local_118[0] = CONCAT26(local_118[0]._6_2_,0x6f00000000);
  local_118[0] = CONCAT44(local_118[0]._4_4_,0x6c6c6548);
  local_108 = "There";
  WVar2 = MakeJsonAndVerify(local_118,local_f8,2,"{\"fixedStr\":\"Hello\",\"strPtr\":\"There\"}");
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":\\\"Hello\\\",\\\"strPtr\\\":\\\"There\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x81);
  local_118[0] = local_118[0] & 0xffffffffffffff00;
  local_108 = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e";
  WVar3 = MakeJsonAndVerify(local_118,local_f8,2,
                            "{\"fixedStr\":null,\"strPtr\":\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\\t\\n\\u000b\\f\\r\\u000e\"}"
                           );
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"\\\\u0001\\\\u0002\\\\u0003\\\\u0004\\\\u0005\\\\u0006\\\\u0007\\\\b\\\\t\\\\n\\\\u000b\\\\f\\\\r\\\\u000e\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x87);
  local_108 = "\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f";
  WVar4 = MakeJsonAndVerify(local_118,local_f8,2,
                            "{\"fixedStr\":null,\"strPtr\":\"\\u0010\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f\"}"
                           );
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"\\\\u0010\\\\u0011\\\\u0012\\\\u0013\\\\u0014\\\\u0015\\\\u0016\\\\u0017\" \"\\\\u0018\\\\u0019\\\\u001a\\\\u001b\\\\u001c\\\\u001d\\\\u001e\\\\u001f\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x8c);
  local_108 = "_\"_";
  WVar5 = MakeJsonAndVerify(local_118,local_f8,2,"{\"fixedStr\":null,\"strPtr\":\"_\\\"_\"}");
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"_\\\\\\\"_\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x90);
  local_108 = "_\\_";
  WVar6 = MakeJsonAndVerify(local_118,local_f8,2,"{\"fixedStr\":null,\"strPtr\":\"_\\\\_\"}");
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"_\\\\\\\\_\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x94);
  local_108 = anon_var_dwarf_4d1;
  WVar7 = MakeJsonAndVerify(local_118,local_f8,2,anon_var_dwarf_18c56);
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"fixedStr\\\":null,\\\"strPtr\\\":\\\"\\xF0\\x9F\\x98\\x81\\\"}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x98);
  local_108 = anon_var_dwarf_9744;
  JVar8 = JlStructToJson(local_118,local_f8,2,false,&local_120);
  if (JVar8 != JL_STATUS_INVALID_DATA) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar8 == JL_STATUS_INVALID_DATA,
                   "(JlStructToJson( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), 0, &jsonString )) == (JL_STATUS_INVALID_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallStrings",0x9d);
  if (((WVar5 != WJTL_STATUS_SUCCESS || WVar6 != WJTL_STATUS_SUCCESS) ||
      ((WVar3 != WJTL_STATUS_SUCCESS || WVar4 != WJTL_STATUS_SUCCESS) ||
      (WVar2 != WJTL_STATUS_SUCCESS || WVar1 != WJTL_STATUS_SUCCESS))) ||
      WVar7 != WJTL_STATUS_SUCCESS) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  return WVar9;
}

Assistant:

static
WJTL_STATUS
    TestMarshallStrings
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        char fixedStr[10];
        char* strPtr;
    } StringStruct;

    JlMarshallElement marshalStringStruct[] =
    {
        JlMarshallStringFixed( StringStruct, fixedStr, "fixedStr" ),
        JlMarshallString( StringStruct, strPtr, "strPtr" ),
    };

    StringStruct theStruct = {{0}};
    char* jsonString = NULL;

    // Check marshalling null strings
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":null,\"strPtr\":null}" ) );

    // Check with strings
    strcpy( theStruct.fixedStr, "Hello" );
    theStruct.strPtr = "There";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":\"Hello\",\"strPtr\":\"There\"}" ) );

    // try with escaped characters
    theStruct.fixedStr[0] = 0;
    theStruct.strPtr = "\x01\x02\x03\x04\x05\x06\x07\x08\x09\x0a\x0b\x0c\x0d\x0e\0xf";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
        "{\"fixedStr\":null,\"strPtr\":\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\\t\\n\\u000b\\f\\r\\u000e\"}" ) );

    theStruct.strPtr = "\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
        "{\"fixedStr\":null,\"strPtr\":\"\\u0010\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017"
        "\\u0018\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f\"}" ) );

    theStruct.strPtr = "_\"_";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                       "{\"fixedStr\":null,\"strPtr\":\"_\\\"_\"}" ) );

    theStruct.strPtr = "_\\_";
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":null,\"strPtr\":\"_\\\\_\"}" ) );

    theStruct.strPtr = "\xF0\x9F\x98\x81";       // smiley face emoji
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"fixedStr\":null,\"strPtr\":\"\xF0\x9F\x98\x81\"}" ) );

    // Test invalid utf8 values (truncated)
    theStruct.strPtr = "\xF0\x9F\x98Truncated";
    JL_ASSERT_STATUS( JlStructToJson( &theStruct, marshalStringStruct, NumElements(marshalStringStruct), false, &jsonString ),
                      JL_STATUS_INVALID_DATA );

    return TestReturn;
}